

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall Logger::Impl::formatTime(Impl *this)

{
  LogStream *pLVar1;
  char local_54 [4];
  tm *ptStack_50;
  char ms [4];
  tm *p_time;
  char str_t [26];
  time_t time;
  timeval tv;
  Impl *this_local;
  
  tv.tv_usec = (__suseconds_t)this;
  memset(&p_time,0,0x1a);
  gettimeofday((timeval *)&time,(__timezone_ptr_t)0x0);
  stack0xffffffffffffffd8 = time;
  ptStack_50 = localtime((time_t *)(str_t + 0x18));
  strftime((char *)&p_time,0x1a,"%Y-%m-%d %H:%M:%S",ptStack_50);
  snprintf(local_54,4,"%03d",tv.tv_sec / 1000 & 0xffffffff);
  pLVar1 = LogStream::operator<<(&this->stream_,(char *)&p_time);
  pLVar1 = LogStream::operator<<(pLVar1,".");
  pLVar1 = LogStream::operator<<(pLVar1,local_54);
  LogStream::operator<<(pLVar1,"    ");
  return;
}

Assistant:

void Logger::Impl::formatTime() {
    struct timeval tv;
    time_t time;
    char str_t[26] = {0};
    gettimeofday(&tv, NULL);
    time = tv.tv_sec;
    struct tm* p_time = localtime(&time);
    strftime(str_t, 26, "%Y-%m-%d %H:%M:%S", p_time);
    char ms[4];
    snprintf(ms, sizeof(ms), "%03d", static_cast<int>(tv.tv_usec/1000));
    stream_ << str_t << "." << ms << "    ";
}